

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O1

void __thiscall
Jupiter::IRC::Client::joinChannel(Client *this,string_view in_channel,string_view in_password)

{
  Socket *this_00;
  size_t sVar1;
  char *__n;
  string local_30;
  
  sVar1 = in_password._M_len;
  __n = in_channel._M_str;
  this_00 = (this->m_socket)._M_t.
            super___uniq_ptr_impl<Jupiter::Socket,_std::default_delete<Jupiter::Socket>_>._M_t.
            super__Tuple_impl<0UL,_Jupiter::Socket_*,_std::default_delete<Jupiter::Socket>_>.
            super__Head_base<0UL,_Jupiter::Socket_*,_false>._M_head_impl;
  string_printf_abi_cxx11_
            (&local_30,"JOIN %.*s %.*s\r\n",in_channel._M_len,__n,sVar1,in_password._M_str);
  Socket::send(this_00,(int)local_30._M_string_length,local_30._M_dataplus._M_p,(size_t)__n,
               (int)sVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Jupiter::IRC::Client::joinChannel(std::string_view in_channel, std::string_view in_password) {
	m_socket->send(string_printf("JOIN %.*s %.*s" ENDL, in_channel.size(), in_channel.data(), in_password.size(), in_password.data()));
}